

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type.h
# Opt level: O1

bool __thiscall slang::ast::Type::isNumeric(Type *this)

{
  bool bVar1;
  bool bVar2;
  
  bVar1 = isIntegral(this);
  bVar2 = true;
  if (!bVar1) {
    if (this->canonical == (Type *)0x0) {
      resolveCanonical(this);
    }
    bVar2 = (this->canonical->super_Symbol).kind == FloatingType;
  }
  return bVar2;
}

Assistant:

bool isNumeric() const { return isIntegral() || isFloating(); }